

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::AssignBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  uint *puVar2;
  int i_1;
  long lVar3;
  int i;
  long lVar4;
  
  this->exponent_ = other->exponent_;
  puVar1 = (other->bigits_).start_;
  puVar2 = (this->bigits_).start_;
  for (lVar4 = 0; lVar3 = (long)other->used_digits_, lVar4 < lVar3; lVar4 = lVar4 + 1) {
    puVar2[lVar4] = puVar1[lVar4];
  }
  puVar1 = (this->bigits_).start_;
  for (; lVar3 < this->used_digits_; lVar3 = lVar3 + 1) {
    puVar1[lVar3] = 0;
  }
  this->used_digits_ = other->used_digits_;
  return;
}

Assistant:

void Bignum::AssignBignum(const Bignum& other) {
  exponent_ = other.exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    bigits_[i] = other.bigits_[i];
  }
  // Clear the excess digits (if there were any).
  for (int i = other.used_digits_; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = other.used_digits_;
}